

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  uint *puVar1;
  float fVar2;
  char cVar3;
  ushort uVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  char *pcVar10;
  long lVar11;
  ImFontGlyph *pIVar12;
  char *text_end_00;
  ImDrawIdx IVar13;
  char *pcVar14;
  char *in_text;
  float scale;
  float fVar15;
  float fVar16;
  float fVar17;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  uint c;
  uint local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ulong local_a0;
  ImDrawIdx *local_98;
  ImDrawVert *local_90;
  uint local_84;
  int local_80;
  int local_7c;
  float local_78;
  undefined1 local_68 [24];
  char *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar31 = pos.y;
  local_78 = wrap_width;
  if (text_end == (char *)0x0) {
    sVar8 = strlen(text_begin);
    text_end = text_begin + sVar8;
  }
  local_b8 = (float)(int)fVar31;
  fVar19 = (float)(int)fVar31;
  fVar20 = (float)(int)fVar31;
  fVar21 = (float)(int)fVar31;
  fVar32 = clip_rect->w;
  if (local_b8 <= fVar32) {
    scale = size / this->FontSize;
    fVar17 = this->FontSize * scale;
    fVar15 = local_b8 + fVar17;
    local_68._0_16_ = ZEXT416((uint)clip_rect->y);
    fStack_b4 = fVar19;
    fStack_b0 = fVar20;
    fStack_ac = fVar21;
    if (text_begin < text_end && (fVar15 < clip_rect->y && local_78 <= 0.0)) {
      do {
        local_b8 = fVar15;
        fStack_b4 = fVar19;
        fStack_b0 = fVar20;
        fStack_ac = fVar21;
        pvVar9 = memchr(text_begin,10,(long)text_end - (long)text_begin);
        text_begin = (char *)((long)pvVar9 + 1);
        if (pvVar9 == (void *)0x0) {
          text_begin = text_end;
        }
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar15 = fVar17 + local_b8;
      } while ((fVar15 < (float)local_68._0_4_) && (text_begin < text_end));
    }
    text_end_00 = text_end;
    if ((local_78 <= 0.0) &&
       (pcVar10 = text_begin, fVar19 = local_b8, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar10, fVar19 < fVar32 && (pcVar10 < text_end))) {
        local_68._0_4_ = fVar19;
        pvVar9 = memchr(pcVar10,10,(long)text_end - (long)pcVar10);
        pcVar10 = (char *)((long)pvVar9 + 1);
        if (pvVar9 == (void *)0x0) {
          pcVar10 = text_end;
        }
        fVar19 = (float)local_68._0_4_ + fVar17;
      }
    }
    if (text_begin != text_end_00) {
      local_48 = (float)(int)pos.x;
      fStack_44 = (float)(int)fVar31;
      fStack_40 = (float)(int)in_XMM1_Dc;
      fStack_3c = (float)(int)in_XMM1_Dd;
      iVar7 = (int)text_end_00 - (int)text_begin;
      local_80 = iVar7 * 6;
      local_7c = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_80,iVar7 * 4);
      local_90 = draw_list->_VtxWritePtr;
      local_98 = draw_list->_IdxWritePtr;
      local_a0 = (ulong)draw_list->_VtxCurrentIdx;
      local_84 = col | 0xffffff;
      local_50 = (char *)0x0;
      fVar31 = local_48;
      fVar32 = local_78;
      fVar19 = local_48;
      fVar20 = local_b8;
      fVar21 = fStack_b4;
      fVar15 = fStack_b0;
      fVar16 = fStack_ac;
      pcVar10 = local_50;
      fVar29 = local_48;
      pcVar14 = text_begin;
joined_r0x0012fe46:
      do {
        if (text_end_00 <= text_begin) break;
        in_text = pcVar14;
        fVar30 = fVar29;
        fVar26 = local_b8;
        fVar2 = fStack_b4;
        fVar27 = fStack_b0;
        fVar18 = fStack_ac;
        pcVar6 = local_50;
        if (0.0 < fVar32) {
          if (pcVar10 == (char *)0x0) {
            local_68._0_4_ = fVar20;
            pcVar10 = CalcWordWrapPositionA
                                (this,scale,text_begin,text_end_00,(fVar19 - fVar31) + fVar32);
            fVar21 = 0.0;
            fVar15 = 0.0;
            fVar16 = 0.0;
            pcVar10 = pcVar10 + (pcVar10 == text_begin);
            fVar20 = (float)local_68._0_4_;
            fVar32 = local_78;
            fVar19 = local_48;
          }
          in_text = text_begin;
          fVar30 = fVar31;
          fVar26 = fVar20;
          fVar2 = fVar21;
          fVar27 = fVar15;
          fVar18 = fVar16;
          pcVar6 = pcVar10;
          if (pcVar10 <= text_begin) {
            pcVar10 = text_begin;
            if (text_begin < text_end_00) {
              lVar11 = (long)text_end_00 - (long)text_begin;
              do {
                cVar3 = *text_begin;
                if ((cVar3 != ' ') && (cVar3 != '\t')) {
                  pcVar10 = text_begin;
                  if (cVar3 == '\n') {
                    pcVar10 = text_begin + 1;
                  }
                  break;
                }
                text_begin = text_begin + 1;
                lVar11 = lVar11 + -1;
                pcVar10 = text_end_00;
              } while (lVar11 != 0);
            }
            text_begin = pcVar10;
            fVar31 = fVar19;
            fVar20 = fVar20 + fVar17;
            pcVar10 = (char *)0x0;
            goto joined_r0x0012fe46;
          }
        }
        local_50 = pcVar6;
        fStack_ac = fVar18;
        fStack_b0 = fVar27;
        fStack_b4 = fVar2;
        local_b8 = fVar26;
        local_bc = (uint)*in_text;
        if (*in_text < '\0') {
          iVar7 = ImTextCharFromUtf8(&local_bc,in_text,text_end_00);
          if (local_bc == 0) break;
          text_begin = in_text + iVar7;
          fVar32 = local_78;
          fVar19 = local_48;
        }
        else {
          text_begin = in_text + 1;
        }
        fVar20 = local_b8;
        fVar31 = fVar30;
        fVar21 = fStack_b4;
        fVar15 = fStack_b0;
        fVar16 = fStack_ac;
        pcVar10 = local_50;
        fVar29 = fVar30;
        pcVar14 = text_begin;
        if (0x1f < local_bc) {
LAB_0012ffcd:
          if (((local_bc & 0xffff) < (uint)(this->IndexLookup).Size) &&
             (uVar4 = (this->IndexLookup).Data[local_bc & 0xffff], uVar4 != 0xffff)) {
            pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar4 * 0x28);
          }
          else {
            pIVar12 = this->FallbackGlyph;
          }
          if (pIVar12 != (ImFontGlyph *)0x0) {
            fVar31 = pIVar12->AdvanceX;
            if (((undefined1  [40])*pIVar12 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
              fVar26 = pIVar12->X0 * scale + fVar30;
              fVar29 = clip_rect->z;
              if (fVar26 <= fVar29) {
                fVar27 = pIVar12->X1 * scale + fVar30;
                fVar2 = clip_rect->x;
                if (fVar2 <= fVar27) {
                  fVar28 = pIVar12->Y0 * scale + local_b8;
                  fVar23 = pIVar12->Y1 * scale + local_b8;
                  fVar18 = pIVar12->U0;
                  fVar25 = pIVar12->V0;
                  fVar24 = pIVar12->U1;
                  fVar22 = pIVar12->V1;
                  if (cpu_fine_clip) {
                    if (fVar26 < fVar2) {
                      fVar18 = fVar18 + (fVar24 - fVar18) *
                                        (1.0 - (fVar27 - fVar2) / (fVar27 - fVar26));
                      fVar26 = fVar2;
                    }
                    fVar2 = clip_rect->y;
                    if (fVar28 < fVar2) {
                      fVar25 = fVar25 + (fVar22 - fVar25) *
                                        (1.0 - (fVar23 - fVar2) / (fVar23 - fVar28));
                      fVar28 = fVar2;
                    }
                    if (fVar29 < fVar27) {
                      fVar24 = (fVar24 - fVar18) * ((fVar29 - fVar26) / (fVar27 - fVar26)) + fVar18;
                      fVar27 = fVar29;
                    }
                    fVar29 = clip_rect->w;
                    if (fVar29 < fVar23) {
                      fVar22 = (fVar22 - fVar25) * ((fVar29 - fVar28) / (fVar23 - fVar28)) + fVar25;
                      fVar23 = fVar29;
                    }
                    if (fVar23 <= fVar28) goto LAB_00130264;
                  }
                  uVar5 = local_84;
                  if (((undefined1  [40])*pIVar12 & (undefined1  [40])0x1) == (undefined1  [40])0x0)
                  {
                    uVar5 = col;
                  }
                  IVar13 = (ImDrawIdx)local_a0;
                  *local_98 = IVar13;
                  local_98[1] = IVar13 + 1;
                  local_98[2] = IVar13 + 2;
                  local_98[3] = IVar13;
                  local_98[4] = IVar13 + 2;
                  local_98[5] = IVar13 + 3;
                  (local_90->pos).x = fVar26;
                  (local_90->pos).y = fVar28;
                  local_90->col = uVar5;
                  (local_90->uv).x = fVar18;
                  (local_90->uv).y = fVar25;
                  local_90[1].pos.x = fVar27;
                  local_90[1].pos.y = fVar28;
                  local_90[1].col = uVar5;
                  local_90[1].uv.x = fVar24;
                  local_90[1].uv.y = fVar25;
                  local_90[2].pos.x = fVar27;
                  local_90[2].pos.y = fVar23;
                  local_90[2].col = uVar5;
                  local_90[2].uv.x = fVar24;
                  local_90[2].uv.y = fVar22;
                  local_90[3].pos.x = fVar26;
                  local_90[3].pos.y = fVar23;
                  local_90[3].col = uVar5;
                  local_90[3].uv.x = fVar18;
                  local_90[3].uv.y = fVar22;
                  local_90 = local_90 + 4;
                  local_a0 = (ulong)((int)local_a0 + 4);
                  local_98 = local_98 + 6;
                }
              }
            }
LAB_00130264:
            fVar31 = fVar30 + fVar31 * scale;
            fVar29 = fVar31;
          }
          goto joined_r0x0012fe46;
        }
        if (local_bc != 10) {
          if (local_bc != 0xd) goto LAB_0012ffcd;
          goto joined_r0x0012fe46;
        }
        local_b8 = local_b8 + fVar17;
        fVar31 = fVar19;
        fVar20 = local_b8;
        fVar29 = fVar19;
      } while (local_b8 < clip_rect->w || local_b8 == clip_rect->w);
      (draw_list->VtxBuffer).Size =
           (int)((ulong)((long)local_90 - (long)(draw_list->VtxBuffer).Data) >> 2) * -0x33333333;
      iVar7 = (int)((ulong)((long)local_98 - (long)(draw_list->IdxBuffer).Data) >> 1);
      (draw_list->IdxBuffer).Size = iVar7;
      lVar11 = (long)(draw_list->CmdBuffer).Size;
      if (lVar11 < 1) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x68b,"T &ImVector<ImDrawCmd>::operator[](int) [T = ImDrawCmd]");
      }
      puVar1 = &(draw_list->CmdBuffer).Data[lVar11 + -1].ElemCount;
      *puVar1 = *puVar1 + (iVar7 - (local_7c + local_80));
      draw_list->_VtxWritePtr = local_90;
      draw_list->_IdxWritePtr = local_98;
      draw_list->_VtxCurrentIdx = (uint)local_a0;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}